

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O3

size_t ltmsize(void *p)

{
  PTrieNode *pPVar1;
  PTrieNode *pPVar2;
  uint uVar3;
  bool bVar4;
  
  if ((short)p != 0) {
    uVar3 = *(int *)((ulong)p & 0xffffffffffff0000) - 3;
    return (ulong)((uVar3 & 3 | 4) << ((char)(uVar3 >> 2) - 2U & 0x1f));
  }
  if (p != (void *)0x0) {
    LOCK();
    UNLOCK();
    if (largeAllocSizes.lock != 0) {
      do {
      } while( true );
    }
    largeAllocSizes.lock = 1;
    pPVar1 = largeAllocSizes.root;
    if (((ulong)largeAllocSizes.root & 1) == 0) {
      do {
        pPVar2 = pPVar1;
        bVar4 = ((ulong)p >> ((ulong)(uint)pPVar2->keys[0] & 0x3f) & 1) != 0;
        pPVar1 = pPVar2->childNodes[bVar4];
      } while (((ulong)pPVar1 & 1) == 0);
      if ((void *)(pPVar2->keys[bVar4] & 0xffffffffffffff00) == p) {
        largeAllocSizes.lock = 0;
        return (ulong)pPVar1 & 0xfffffffffffffffe;
      }
    }
    __assert_fail("lastKey && (*lastKey & ~0xFF) == key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                  ,0x203,"uintptr_t ptrie_lookup(PTrie *, uintptr_t)");
  }
  return 0;
}

Assistant:

size_t ltmsize(void* p)
{
	if (likely((uintptr_t)p & (CHUNK_SIZE - 1)))
	{
		return class_to_size(((Chunk*)((uintptr_t)p & ~(CHUNK_SIZE - 1)))->sizeClass);
	}
	else
	{
		if (p == NULL) return 0;

#if LTALLOC_HAS_VMSIZE
		size_t size = LTALLOC_VMSIZE(p);
#else
		size_t size = ptrie_lookup(&largeAllocSizes, (uintptr_t)p);
#endif

#ifdef LTALLOC_OVERFLOW_DETECTION
		size -= LTALLOC_CANARY_SIZE;
#endif

		return size;
	}
}